

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTMain.cpp
# Opt level: O2

positionTy * GetAirportLoc(positionTy *__return_storage_ptr__,string *sICAO)

{
  undefined1 auVar1 [16];
  positionTy *ppVar2;
  bool bVar3;
  int iVar4;
  float alt;
  float lon;
  float lat;
  positionTy *local_60;
  char sId [32];
  
  lat = NAN;
  lon = NAN;
  alt = NAN;
  local_60 = __return_storage_ptr__;
  iVar4 = XPLMFindFirstNavAidOfType(1);
  while( true ) {
    ppVar2 = local_60;
    if (iVar4 == -1) {
      positionTy::positionTy(local_60);
      return ppVar2;
    }
    XPLMGetNavAidInfo(iVar4,0,&lat,&lon,&alt,0,0,sId,0,0);
    bVar3 = std::operator==(sICAO,sId);
    if (bVar3) break;
    iVar4 = XPLMGetNextNavAid(iVar4);
  }
  auVar1._8_4_ = SUB84((double)lon,0);
  auVar1._0_8_ = (double)lat;
  auVar1._12_4_ = (int)((ulong)(double)lon >> 0x20);
  local_60->_lat = (double)lat;
  local_60->_lon = (double)auVar1._8_8_;
  local_60->_alt = (double)alt;
  local_60->_ts = NAN;
  local_60->_head = NAN;
  local_60->_pitch = NAN;
  local_60->_roll = NAN;
  local_60->mergeCount = 1;
  local_60->f = (posFlagsTy)((ushort)local_60->f & 0x8000);
  local_60->edgeIdx = 0xffffffffffffffff;
  return local_60;
}

Assistant:

positionTy GetAirportLoc (const std::string sICAO)
{
    char sId[32];
    float lat=NAN, lon=NAN, alt=NAN;

    // Loop all airorts
    for (XPLMNavRef navRef = XPLMFindFirstNavAidOfType(xplm_Nav_Airport);
         navRef != XPLM_NAV_NOT_FOUND;
         navRef = XPLMGetNextNavAid(navRef))
    {
        // Get info and check if this is the one
        XPLMGetNavAidInfo(navRef, nullptr,
                          &lat, &lon, &alt,
                          nullptr, nullptr, sId, nullptr, nullptr);
        if (sICAO == sId)
            return positionTy(lat, lon, alt);
    }
    // not found
    return positionTy();
}